

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall
QWidgetWindow::handleWindowStateChangedEvent(QWidgetWindow *this,QWindowStateChangeEvent *event)

{
  uint uVar1;
  long lVar2;
  Data *pDVar3;
  WindowStates WVar4;
  uint uVar5;
  uint uVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)(event + 0x10);
  WVar4 = QWidget::windowState((QWidget *)(this->m_widget).wp.value);
  uVar5 = QWindow::windowStates();
  if ((uVar5 & 1) == 0) {
    uVar6 = uVar5 | (uint)WVar4.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                          super_QFlagsStorage<Qt::WindowState>.i & 8;
    if (uVar5 != 0) {
      updateNormalGeometry(this);
    }
  }
  else {
    uVar6 = (uint)WVar4.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                  super_QFlagsStorage<Qt::WindowState>.i | 1;
  }
  lVar2 = *(long *)((this->m_widget).wp.value + 0x20);
  uVar5 = *(uint *)(lVar2 + 0x10);
  if (uVar6 != (uVar5 & 0xf)) {
    *(uint *)(lVar2 + 0x10) = uVar5 & 0xfffffff0 | uVar6 & 0xf;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaa;
    uStack_44 = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    pQVar7 = (QObject *)0x0;
    QWindowStateChangeEvent::QWindowStateChangeEvent
              ((QWindowStateChangeEvent *)&local_48,
               (uint)WVar4.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                     super_QFlagsStorage<Qt::WindowState>.i & 8 | uVar1,0);
    pDVar3 = (this->m_widget).wp.d;
    if (pDVar3 != (Data *)0x0) {
      if (*(int *)(pDVar3 + 4) == 0) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = (this->m_widget).wp.value;
      }
    }
    QCoreApplication::forwardEvent(pQVar7,(QEvent *)&local_48,(QEvent *)event);
    QWindowStateChangeEvent::~QWindowStateChangeEvent((QWindowStateChangeEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleWindowStateChangedEvent(QWindowStateChangeEvent *event)
{
    // QWindow does currently not know 'active'.
    Qt::WindowStates eventState = event->oldState();
    Qt::WindowStates widgetState = m_widget->windowState();
    Qt::WindowStates windowState = windowStates();
    if (widgetState & Qt::WindowActive)
        eventState |= Qt::WindowActive;

    // Determine the new widget state, remember maximized/full screen
    // during minimized.
    if (windowState & Qt::WindowMinimized) {
        widgetState |= Qt::WindowMinimized;
    } else {
        widgetState = windowState | (widgetState & Qt::WindowActive);
        if (windowState) // Maximized or FullScreen
            updateNormalGeometry();
    }

    // Sent event if the state changed (that is, it is not triggered by
    // QWidget::setWindowState(), which also sends an event to the widget).
    if (widgetState != Qt::WindowStates::Int(m_widget->data->window_state)) {
        m_widget->data->window_state = uint(widgetState);
        QWindowStateChangeEvent widgetEvent(eventState);
        QGuiApplication::forwardEvent(m_widget, &widgetEvent, event);
    }
}